

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O0

bool __thiscall ManifestParser::ParseEdge(ManifestParser *this,string *err)

{
  pointer *key_00;
  State *pSVar1;
  bool bVar2;
  Edge *this_00;
  ulong uVar3;
  vector<Node_*,_std::allocator<Node_*>_> *pvVar4;
  size_type sVar5;
  reference this_01;
  undefined8 uVar6;
  pointer this_02;
  reference ppNVar7;
  Node *pNVar8;
  BindingEnv *local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_468;
  Node **local_460;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_458;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_450;
  iterator dgi;
  uint64_t local_438;
  uint64_t slash_bits_2;
  string dyndep;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_408;
  const_iterator local_400;
  const_iterator local_3f8;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_3f0;
  Node **local_3e8;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_3e0;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_3d8;
  iterator new_end;
  Node *out_2;
  uint64_t local_3b8;
  uint64_t slash_bits_1;
  string path_err_1;
  string path_1;
  __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_> local_368;
  iterator i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  StringPiece local_320;
  uint64_t local_310;
  uint64_t slash_bits;
  string path_err;
  string path;
  size_t e;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  Pool *local_278;
  Pool *pool;
  string local_268;
  undefined1 local_248 [8];
  string pool_name;
  Edge *edge;
  undefined1 local_200 [8];
  EvalString val;
  string key;
  BindingEnv *env;
  undefined1 local_1a8 [7];
  bool has_indent_token;
  EvalString in_2;
  undefined1 local_188 [4];
  int order_only;
  EvalString in_1;
  undefined1 local_168 [4];
  int implicit;
  EvalString in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  Rule *local_110;
  Rule *rule;
  string local_100;
  undefined1 local_e0 [8];
  string rule_name;
  string local_b8;
  undefined1 local_98 [8];
  EvalString out_1;
  int local_78;
  int implicit_outs;
  undefined1 local_68 [8];
  EvalString out;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  string *err_local;
  ManifestParser *this_local;
  
  std::vector<EvalString,_std::allocator<EvalString>_>::vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<EvalString,_std::allocator<EvalString>_>::vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &out.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  EvalString::EvalString((EvalString *)local_68);
  bVar2 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_68,err);
  if (bVar2) {
    do {
      bVar2 = EvalString::empty((EvalString *)local_68);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        bVar2 = false;
        goto LAB_001eda66;
      }
      std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                ((vector<EvalString,_std::allocator<EvalString>_> *)
                 &out.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_68);
      EvalString::Clear((EvalString *)local_68);
      bVar2 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_68,err);
    } while (bVar2);
    this_local._7_1_ = 0;
    bVar2 = true;
  }
  else {
    this_local._7_1_ = 0;
    bVar2 = true;
  }
LAB_001eda66:
  EvalString::~EvalString((EvalString *)local_68);
  if (bVar2) goto LAB_001ef07c;
  out_1.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  bVar2 = Lexer::PeekToken(&(this->super_Parser).lexer_,PIPE);
  if (bVar2) {
    do {
      EvalString::EvalString((EvalString *)local_98);
      bVar2 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_98,err);
      if (bVar2) {
        bVar2 = EvalString::empty((EvalString *)local_98);
        if (bVar2) {
          local_78 = 4;
        }
        else {
          std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                    ((vector<EvalString,_std::allocator<EvalString>_> *)
                     &out.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_98);
          out_1.parsed_.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               out_1.parsed_.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          local_78 = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
        local_78 = 1;
      }
      EvalString::~EvalString((EvalString *)local_98);
    } while (local_78 == 0);
    if (local_78 != 4) goto LAB_001ef07c;
  }
  bVar2 = std::vector<EvalString,_std::allocator<EvalString>_>::empty
                    ((vector<EvalString,_std::allocator<EvalString>_> *)
                     &out.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"expected path",
               (allocator<char> *)(rule_name.field_2._M_local_buf + 0xf));
    this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_b8,err);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)(rule_name.field_2._M_local_buf + 0xf));
    goto LAB_001ef07c;
  }
  bVar2 = Parser::ExpectToken(&this->super_Parser,COLON,err);
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_001ef07c;
  }
  std::__cxx11::string::string((string *)local_e0);
  bVar2 = Lexer::ReadIdent(&(this->super_Parser).lexer_,(string *)local_e0);
  if (bVar2) {
    local_110 = BindingEnv::LookupRule(this->env_,(string *)local_e0);
    if (local_110 == (Rule *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &in.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"unknown build rule \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &in.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"\'");
      this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_130,err);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string
                ((string *)
                 &in.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      do {
        EvalString::EvalString((EvalString *)local_168);
        bVar2 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_168,err);
        if (bVar2) {
          bVar2 = EvalString::empty((EvalString *)local_168);
          if (bVar2) {
            local_78 = 6;
          }
          else {
            std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                      ((vector<EvalString,_std::allocator<EvalString>_> *)
                       &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(value_type *)local_168);
            local_78 = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
          local_78 = 1;
        }
        EvalString::~EvalString((EvalString *)local_168);
      } while (local_78 == 0);
      if (local_78 == 6) {
        in_1.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        bVar2 = Lexer::PeekToken(&(this->super_Parser).lexer_,PIPE);
        if (bVar2) {
          do {
            EvalString::EvalString((EvalString *)local_188);
            bVar2 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_188,err);
            if (bVar2) {
              bVar2 = EvalString::empty((EvalString *)local_188);
              if (bVar2) {
                local_78 = 8;
              }
              else {
                std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                          ((vector<EvalString,_std::allocator<EvalString>_> *)
                           &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage,(value_type *)local_188);
                in_1.parsed_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     in_1.parsed_.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
                local_78 = 0;
              }
            }
            else {
              this_local._7_1_ = 0;
              local_78 = 1;
            }
            EvalString::~EvalString((EvalString *)local_188);
          } while (local_78 == 0);
          if (local_78 != 8) goto LAB_001ef060;
        }
        in_2.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        bVar2 = Lexer::PeekToken(&(this->super_Parser).lexer_,PIPE2);
        if (bVar2) {
          do {
            EvalString::EvalString((EvalString *)local_1a8);
            bVar2 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_1a8,err);
            if (bVar2) {
              bVar2 = EvalString::empty((EvalString *)local_1a8);
              if (bVar2) {
                local_78 = 10;
              }
              else {
                std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                          ((vector<EvalString,_std::allocator<EvalString>_> *)
                           &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage,(value_type *)local_1a8);
                in_2.parsed_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     in_2.parsed_.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
                local_78 = 0;
              }
            }
            else {
              this_local._7_1_ = 0;
              local_78 = 1;
            }
            EvalString::~EvalString((EvalString *)local_1a8);
          } while (local_78 == 0);
          if (local_78 != 10) goto LAB_001ef060;
        }
        bVar2 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
        if (bVar2) {
          env._7_1_ = Lexer::PeekToken(&(this->super_Parser).lexer_,INDENT);
          if (env._7_1_) {
            local_580 = (BindingEnv *)operator_new(0x70);
            BindingEnv::BindingEnv(local_580,this->env_);
          }
          else {
            local_580 = this->env_;
          }
          do {
            if (env._7_1_ == false) {
              this_00 = State::AddEdge((this->super_Parser).state_,local_110);
              this_00->env_ = local_580;
              pool_name.field_2._8_8_ = this_00;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_268,"pool",(allocator<char> *)((long)&pool + 7));
              Edge::GetBinding((string *)local_248,this_00,&local_268);
              std::__cxx11::string::~string((string *)&local_268);
              std::allocator<char>::~allocator((allocator<char> *)((long)&pool + 7));
              uVar3 = std::__cxx11::string::empty();
              if ((uVar3 & 1) == 0) {
                local_278 = State::LookupPool((this->super_Parser).state_,(string *)local_248);
                if (local_278 == (Pool *)0x0) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&i,"unknown pool name \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_248);
                  std::operator+(&local_298,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&i,"\'");
                  this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_298,err);
                  std::__cxx11::string::~string((string *)&local_298);
                  std::__cxx11::string::~string((string *)&i);
                  goto LAB_001ef044;
                }
                *(Pool **)(pool_name.field_2._8_8_ + 8) = local_278;
              }
              pvVar4 = (vector<Node_*,_std::allocator<Node_*>_> *)(pool_name.field_2._8_8_ + 0x28);
              sVar5 = std::vector<EvalString,_std::allocator<EvalString>_>::size
                                ((vector<EvalString,_std::allocator<EvalString>_> *)
                                 &out.parsed_.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<Node_*,_std::allocator<Node_*>_>::reserve(pvVar4,sVar5);
              e = 0;
              sVar5 = std::vector<EvalString,_std::allocator<EvalString>_>::size
                                ((vector<EvalString,_std::allocator<EvalString>_> *)
                                 &out.parsed_.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              goto LAB_001ee6f8;
            }
            key_00 = &val.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::string((string *)key_00);
            EvalString::EvalString((EvalString *)local_200);
            bVar2 = ParseLet(this,(string *)key_00,(EvalString *)local_200,err);
            if (bVar2) {
              EvalString::Evaluate_abi_cxx11_
                        ((string *)&edge,(EvalString *)local_200,&this->env_->super_Env);
              BindingEnv::AddBinding
                        (local_580,
                         (string *)
                         &val.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&edge);
              std::__cxx11::string::~string((string *)&edge);
              env._7_1_ = Lexer::PeekToken(&(this->super_Parser).lexer_,INDENT);
            }
            else {
              this_local._7_1_ = 0;
            }
            EvalString::~EvalString((EvalString *)local_200);
            std::__cxx11::string::~string
                      ((string *)
                       &val.parsed_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          } while (bVar2);
        }
        else {
          this_local._7_1_ = 0;
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"expected build command name",
               (allocator<char> *)((long)&rule + 7));
    this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_100,err);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rule + 7));
  }
LAB_001ef060:
  std::__cxx11::string::~string((string *)local_e0);
LAB_001ef07c:
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &out.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (bool)(this_local._7_1_ & 1);
LAB_001ee6f8:
  if (e == sVar5) goto LAB_001ee9bc;
  this_01 = std::vector<EvalString,_std::allocator<EvalString>_>::operator[]
                      ((vector<EvalString,_std::allocator<EvalString>_> *)
                       &out.parsed_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,e);
  EvalString::Evaluate_abi_cxx11_
            ((string *)((long)&path_err.field_2 + 8),this_01,&local_580->super_Env);
  std::__cxx11::string::string((string *)&slash_bits);
  bVar2 = CanonicalizePath((string *)((long)&path_err.field_2 + 8),&local_310,(string *)&slash_bits)
  ;
  uVar6 = pool_name.field_2._8_8_;
  if (bVar2) {
    pSVar1 = (this->super_Parser).state_;
    StringPiece::StringPiece(&local_320,(string *)((long)&path_err.field_2 + 8));
    bVar2 = State::AddOut(pSVar1,(Edge *)uVar6,local_320,local_310);
    if (!bVar2) {
      if ((this->options_).dupe_edge_action_ == kDupeEdgeActionError) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                       "multiple rules generate ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&path_err.field_2 + 8));
        std::operator+(&local_340,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                       " [-w dupbuild=err]");
        Lexer::Error(&(this->super_Parser).lexer_,&local_340,err);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&i_1);
        this_local._7_1_ = 0;
        bVar2 = true;
        goto LAB_001ee961;
      }
      if ((this->quiet_ & 1U) == 0) {
        uVar6 = std::__cxx11::string::c_str();
        Warning("multiple rules generate %s. builds involving this target will not be correct; continuing anyway [-w dupbuild=warn]"
                ,uVar6);
      }
      if (sVar5 - e <=
          (ulong)(long)out_1.parsed_.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
        out_1.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             out_1.parsed_.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1;
      }
    }
    bVar2 = false;
  }
  else {
    this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,(string *)&slash_bits,err);
    bVar2 = true;
  }
LAB_001ee961:
  std::__cxx11::string::~string((string *)&slash_bits);
  std::__cxx11::string::~string((string *)(path_err.field_2._M_local_buf + 8));
  if (bVar2) goto LAB_001ef044;
  e = e + 1;
  goto LAB_001ee6f8;
LAB_001ee9bc:
  bVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::empty
                    ((vector<Node_*,_std::allocator<Node_*>_> *)(pool_name.field_2._8_8_ + 0x28));
  if (bVar2) {
    std::vector<Edge_*,_std::allocator<Edge_*>_>::pop_back(&((this->super_Parser).state_)->edges_);
    uVar6 = pool_name.field_2._8_8_;
    if (pool_name.field_2._8_8_ != 0) {
      Edge::~Edge((Edge *)pool_name.field_2._8_8_);
      operator_delete((void *)uVar6,0x68);
    }
    this_local._7_1_ = 1;
  }
  else {
    *(int *)(pool_name.field_2._8_8_ + 0x60) =
         out_1.parsed_.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar4 = (vector<Node_*,_std::allocator<Node_*>_> *)(pool_name.field_2._8_8_ + 0x10);
    sVar5 = std::vector<EvalString,_std::allocator<EvalString>_>::size
                      ((vector<EvalString,_std::allocator<EvalString>_> *)
                       &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    std::vector<Node_*,_std::allocator<Node_*>_>::reserve(pvVar4,sVar5);
    local_368._M_current =
         (EvalString *)
         std::vector<EvalString,_std::allocator<EvalString>_>::begin
                   ((vector<EvalString,_std::allocator<EvalString>_> *)
                    &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      path_1.field_2._8_8_ =
           std::vector<EvalString,_std::allocator<EvalString>_>::end
                     ((vector<EvalString,_std::allocator<EvalString>_> *)
                      &outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      bVar2 = __gnu_cxx::operator!=
                        (&local_368,
                         (__normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                          *)((long)&path_1.field_2 + 8));
      if (!bVar2) break;
      this_02 = __gnu_cxx::
                __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                ::operator->(&local_368);
      EvalString::Evaluate_abi_cxx11_
                ((string *)((long)&path_err_1.field_2 + 8),this_02,&local_580->super_Env);
      std::__cxx11::string::string((string *)&slash_bits_1);
      bVar2 = CanonicalizePath((string *)((long)&path_err_1.field_2 + 8),&local_3b8,
                               (string *)&slash_bits_1);
      uVar6 = pool_name.field_2._8_8_;
      if (bVar2) {
        pSVar1 = (this->super_Parser).state_;
        StringPiece::StringPiece((StringPiece *)&out_2,(string *)((long)&path_err_1.field_2 + 8));
        State::AddIn(pSVar1,(Edge *)uVar6,_out_2,local_3b8);
      }
      else {
        this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,(string *)&slash_bits_1,err);
      }
      std::__cxx11::string::~string((string *)&slash_bits_1);
      std::__cxx11::string::~string((string *)(path_err_1.field_2._M_local_buf + 8));
      if (!bVar2) goto LAB_001ef044;
      __gnu_cxx::
      __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>::
      operator++(&local_368);
    }
    *(int *)(pool_name.field_2._8_8_ + 0x58) =
         in_1.parsed_.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    *(int *)(pool_name.field_2._8_8_ + 0x5c) =
         in_2.parsed_.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    if (((this->options_).phony_cycle_action_ == kPhonyCycleActionWarn) &&
       (bVar2 = Edge::maybe_phonycycle_diagnostic((Edge *)pool_name.field_2._8_8_), bVar2)) {
      ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           (pool_name.field_2._8_8_ + 0x28),0);
      new_end._M_current = (Node **)*ppNVar7;
      local_3e0._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               (pool_name.field_2._8_8_ + 0x10));
      local_3e8 = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                     ((vector<Node_*,_std::allocator<Node_*>_> *)
                                      (pool_name.field_2._8_8_ + 0x10));
      local_3d8 = std::
                  remove<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,Node*>
                            (local_3e0,
                             (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                              )local_3e8,(Node **)&new_end);
      local_3f0._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               (pool_name.field_2._8_8_ + 0x10));
      bVar2 = __gnu_cxx::operator!=(&local_3d8,&local_3f0);
      if (bVar2) {
        pvVar4 = (vector<Node_*,_std::allocator<Node_*>_> *)(pool_name.field_2._8_8_ + 0x10);
        __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
        __normal_iterator<Node**>
                  ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)
                   &local_3f8,&local_3d8);
        local_408._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                ((vector<Node_*,_std::allocator<Node_*>_> *)
                                 (pool_name.field_2._8_8_ + 0x10));
        __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
        __normal_iterator<Node**>
                  ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)
                   &local_400,&local_408);
        dyndep.field_2._8_8_ =
             std::vector<Node_*,_std::allocator<Node_*>_>::erase(pvVar4,local_3f8,local_400);
        if ((this->quiet_ & 1U) == 0) {
          Node::path_abi_cxx11_((Node *)new_end._M_current);
          uVar6 = std::__cxx11::string::c_str();
          Warning("phony target \'%s\' names itself as an input; ignoring [-w phonycycle=warn]",
                  uVar6);
        }
      }
    }
    Edge::GetUnescapedDyndep_abi_cxx11_((string *)&slash_bits_2,(Edge *)pool_name.field_2._8_8_);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      bVar2 = CanonicalizePath((string *)&slash_bits_2,&local_438,err);
      if (bVar2) {
        pSVar1 = (this->super_Parser).state_;
        StringPiece::StringPiece((StringPiece *)&dgi,(string *)&slash_bits_2);
        pNVar8 = State::GetNode(pSVar1,_dgi,local_438);
        *(Node **)(pool_name.field_2._8_8_ + 0x40) = pNVar8;
        Node::set_dyndep_pending(*(Node **)(pool_name.field_2._8_8_ + 0x40),true);
        local_458._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                                ((vector<Node_*,_std::allocator<Node_*>_> *)
                                 (pool_name.field_2._8_8_ + 0x10));
        local_460 = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                       ((vector<Node_*,_std::allocator<Node_*>_> *)
                                        (pool_name.field_2._8_8_ + 0x10));
        local_450 = std::
                    find<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,Node*>
                              (local_458,
                               (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                )local_460,(Node **)(pool_name.field_2._8_8_ + 0x40));
        local_468._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                ((vector<Node_*,_std::allocator<Node_*>_> *)
                                 (pool_name.field_2._8_8_ + 0x10));
        bVar2 = __gnu_cxx::operator==(&local_450,&local_468);
        if (!bVar2) goto LAB_001ef01d;
        std::operator+(&local_4a8,"dyndep \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &slash_bits_2);
        std::operator+(&local_488,&local_4a8,"\' is not an input");
        this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_488,err);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
LAB_001ef01d:
      this_local._7_1_ = true;
    }
    std::__cxx11::string::~string((string *)&slash_bits_2);
  }
LAB_001ef044:
  std::__cxx11::string::~string((string *)local_248);
  goto LAB_001ef060;
}

Assistant:

bool ManifestParser::ParseEdge(string* err) {
  vector<EvalString> ins, outs;

  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    while (!out.empty()) {
      outs.push_back(out);

      out.Clear();
      if (!lexer_.ReadPath(&out, err))
        return false;
    }
  }

  // Add all implicit outs, counting how many as we go.
  int implicit_outs = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return false;
      if (out.empty())
        break;
      outs.push_back(out);
      ++implicit_outs;
    }
  }

  if (outs.empty())
    return lexer_.Error("expected path", err);

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name))
    return lexer_.Error("expected build command name", err);

  const Rule* rule = env_->LookupRule(rule_name);
  if (!rule)
    return lexer_.Error("unknown build rule '" + rule_name + "'", err);

  for (;;) {
    // XXX should we require one path here?
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (in.empty())
      break;
    ins.push_back(in);
  }

  // Add all implicit deps, counting how many as we go.
  int implicit = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++implicit;
    }
  }

  // Add all order-only deps, counting how many as we go.
  int order_only = 0;
  if (lexer_.PeekToken(Lexer::PIPE2)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++order_only;
    }
  }

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  // Bindings on edges are rare, so allocate per-edge envs only when needed.
  bool has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  BindingEnv* env = has_indent_token ? new BindingEnv(env_) : env_;
  while (has_indent_token) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;

    env->AddBinding(key, val.Evaluate(env_));
    has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  }

  Edge* edge = state_->AddEdge(rule);
  edge->env_ = env;

  string pool_name = edge->GetBinding("pool");
  if (!pool_name.empty()) {
    Pool* pool = state_->LookupPool(pool_name);
    if (pool == NULL)
      return lexer_.Error("unknown pool name '" + pool_name + "'", err);
    edge->pool_ = pool;
  }

  edge->outputs_.reserve(outs.size());
  for (size_t i = 0, e = outs.size(); i != e; ++i) {
    string path = outs[i].Evaluate(env);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    if (!state_->AddOut(edge, path, slash_bits)) {
      if (options_.dupe_edge_action_ == kDupeEdgeActionError) {
        lexer_.Error("multiple rules generate " + path + " [-w dupbuild=err]",
                     err);
        return false;
      } else {
        if (!quiet_) {
          Warning("multiple rules generate %s. "
                  "builds involving this target will not be correct; "
                  "continuing anyway [-w dupbuild=warn]",
                  path.c_str());
        }
        if (e - i <= static_cast<size_t>(implicit_outs))
          --implicit_outs;
      }
    }
  }
  if (edge->outputs_.empty()) {
    // All outputs of the edge are already created by other edges. Don't add
    // this edge.  Do this check before input nodes are connected to the edge.
    state_->edges_.pop_back();
    delete edge;
    return true;
  }
  edge->implicit_outs_ = implicit_outs;

  edge->inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(env);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    state_->AddIn(edge, path, slash_bits);
  }
  edge->implicit_deps_ = implicit;
  edge->order_only_deps_ = order_only;

  if (options_.phony_cycle_action_ == kPhonyCycleActionWarn &&
      edge->maybe_phonycycle_diagnostic()) {
    // CMake 2.8.12.x and 3.0.x incorrectly write phony build statements
    // that reference themselves.  Ninja used to tolerate these in the
    // build graph but that has since been fixed.  Filter them out to
    // support users of those old CMake versions.
    Node* out = edge->outputs_[0];
    vector<Node*>::iterator new_end =
        remove(edge->inputs_.begin(), edge->inputs_.end(), out);
    if (new_end != edge->inputs_.end()) {
      edge->inputs_.erase(new_end, edge->inputs_.end());
      if (!quiet_) {
        Warning("phony target '%s' names itself as an input; "
                "ignoring [-w phonycycle=warn]",
                out->path().c_str());
      }
    }
  }

  // Lookup, validate, and save any dyndep binding.  It will be used later
  // to load generated dependency information dynamically, but it must
  // be one of our manifest-specified inputs.
  string dyndep = edge->GetUnescapedDyndep();
  if (!dyndep.empty()) {
    uint64_t slash_bits;
    if (!CanonicalizePath(&dyndep, &slash_bits, err))
      return false;
    edge->dyndep_ = state_->GetNode(dyndep, slash_bits);
    edge->dyndep_->set_dyndep_pending(true);
    vector<Node*>::iterator dgi =
      std::find(edge->inputs_.begin(), edge->inputs_.end(), edge->dyndep_);
    if (dgi == edge->inputs_.end()) {
      return lexer_.Error("dyndep '" + dyndep + "' is not an input", err);
    }
  }

  return true;
}